

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

int * Ssw_SmlCheckOutputSavePattern(Ssw_Sml_t *p,Aig_Obj_t *pObjPo)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  uint *puVar4;
  int *piVar5;
  void *pvVar6;
  int *pModel;
  int local_38;
  int BestPat;
  int k;
  int i;
  uint *pSims;
  Aig_Obj_t *pObjPi;
  Aig_Obj_t *pFanin;
  Aig_Obj_t *pObjPo_local;
  Ssw_Sml_t *p_local;
  
  pAVar3 = Aig_ObjFanin0(pObjPo);
  puVar4 = Ssw_ObjSim(p,pAVar3->Id);
  for (BestPat = 0; (BestPat < p->nWordsTotal && (puVar4[BestPat] == 0)); BestPat = BestPat + 1) {
  }
  if (p->nWordsTotal <= BestPat) {
    __assert_fail("i < p->nWordsTotal",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x1c3,"int *Ssw_SmlCheckOutputSavePattern(Ssw_Sml_t *, Aig_Obj_t *)");
  }
  local_38 = 0;
  while ((local_38 < 0x20 && ((puVar4[BestPat] & 1 << ((byte)local_38 & 0x1f)) == 0))) {
    local_38 = local_38 + 1;
  }
  if (local_38 < 0x20) {
    iVar1 = BestPat * 0x20;
    iVar2 = Aig_ManCiNum(p->pAig);
    piVar5 = (int *)malloc((long)(iVar2 + 1) << 2);
    for (BestPat = 0; iVar2 = Vec_PtrSize(p->pAig->vCis), BestPat < iVar2; BestPat = BestPat + 1) {
      pvVar6 = Vec_PtrEntry(p->pAig->vCis,BestPat);
      puVar4 = Ssw_ObjSim(p,*(int *)((long)pvVar6 + 0x24));
      iVar2 = Abc_InfoHasBit(puVar4,iVar1 + local_38);
      piVar5[BestPat] = iVar2;
    }
    iVar1 = pObjPo->Id;
    iVar2 = Aig_ManCiNum(p->pAig);
    piVar5[iVar2] = iVar1;
    return piVar5;
  }
  __assert_fail("k < 32",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                ,0x1c8,"int *Ssw_SmlCheckOutputSavePattern(Ssw_Sml_t *, Aig_Obj_t *)");
}

Assistant:

int * Ssw_SmlCheckOutputSavePattern( Ssw_Sml_t * p, Aig_Obj_t * pObjPo )
{
    Aig_Obj_t * pFanin, * pObjPi;
    unsigned * pSims;
    int i, k, BestPat, * pModel;
    // find the word of the pattern
    pFanin = Aig_ObjFanin0(pObjPo);
    pSims = Ssw_ObjSim(p, pFanin->Id);
    for ( i = 0; i < p->nWordsTotal; i++ )
        if ( pSims[i] )
            break;
    assert( i < p->nWordsTotal );
    // find the bit of the pattern
    for ( k = 0; k < 32; k++ )
        if ( pSims[i] & (1 << k) )
            break;
    assert( k < 32 );
    // determine the best pattern
    BestPat = i * 32 + k;
    // fill in the counter-example data
    pModel = ABC_ALLOC( int, Aig_ManCiNum(p->pAig)+1 );
    Aig_ManForEachCi( p->pAig, pObjPi, i )
    {
        pModel[i] = Abc_InfoHasBit(Ssw_ObjSim(p, pObjPi->Id), BestPat);
//        Abc_Print( 1, "%d", pModel[i] );
    }
    pModel[Aig_ManCiNum(p->pAig)] = pObjPo->Id;
//    Abc_Print( 1, "\n" );
    return pModel;
}